

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cookptravltree.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  PtrAVLTree PVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  ostream *poVar5;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  int i;
  long lVar6;
  int iVar7;
  long lVar8;
  PtrAVLTree list;
  size_t size;
  Node n [20];
  PtrAVLTree local_4a8;
  PtrAVLTree local_4a0;
  Node local_498;
  Node local_460;
  char local_428 [56];
  char local_3f0 [56];
  char local_3b8 [56];
  Node local_380;
  char local_348 [56];
  char local_310 [56];
  Node local_2d8;
  char local_2a0 [56];
  char local_268 [56];
  char local_230 [56];
  char local_1f8 [56];
  char local_1c0 [56];
  Node local_188;
  char local_150 [56];
  char local_118 [56];
  char local_e0 [56];
  char local_a8 [56];
  Node local_70;
  
  local_4a8.m_root = (Node *)0x0;
  local_4a0.m_root = (Node *)0x0;
  iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    lVar6 = 0;
    do {
      if (local_4a8.m_root != (Node *)0x0) {
        uVar1 = *(ulong *)((long)&local_498 + lVar6 * 0x38 + 8);
        PVar4.m_root = local_4a8.m_root;
        do {
          lVar8 = 0x10;
          if ((uVar1 < (PVar4.m_root)->size) || (lVar8 = 0x18, (PVar4.m_root)->size < uVar1)) {
            PVar4.m_root = *(Node **)((long)&(PVar4.m_root)->reserved + lVar8);
          }
          else {
            do {
              if (PVar4.m_root == (Node *)((long)&local_498 + lVar6 * 0x38)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Mismatch at line ",0x11);
                iVar2 = 0x28;
                goto LAB_00101568;
              }
              PVar4.m_root = (PVar4.m_root)->next;
            } while (PVar4.m_root != (Node *)0x0);
            PVar4.m_root = (Node *)0x0;
          }
        } while (PVar4.m_root != (Node *)0x0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x14);
    cookmem::PtrAVLTree::add(&local_4a8,&local_498,10);
    cookmem::PtrAVLTree::add(&local_4a8,&local_460,0x14);
    cookmem::PtrAVLTree::add(&local_4a8,local_428,0x1e);
    cookmem::PtrAVLTree::add(&local_4a8,local_3f0,0x28);
    cookmem::PtrAVLTree::add(&local_4a8,local_3b8,0x32);
    cookmem::PtrAVLTree::add(&local_4a8,&local_380,0x14);
    cookmem::PtrAVLTree::add(&local_4a8,local_348,0x28);
    cookmem::PtrAVLTree::add(&local_4a8,local_310,0x50);
    cookmem::PtrAVLTree::add(&local_4a8,&local_2d8,0x96);
    cookmem::PtrAVLTree::add(&local_4a8,local_2a0,0xfa);
    cookmem::PtrAVLTree::add(&local_4a8,local_268,0x3c);
    cookmem::PtrAVLTree::add(&local_4a8,local_230,0xdc);
    cookmem::PtrAVLTree::add(&local_4a8,local_1f8,0x14a);
    cookmem::PtrAVLTree::add(&local_4a8,local_1c0,0x1b8);
    cookmem::PtrAVLTree::add(&local_4a8,&local_188,0x226);
    cookmem::PtrAVLTree::add(&local_4a8,local_150,0x140);
    cookmem::PtrAVLTree::add(&local_4a8,local_118,0x154);
    cookmem::PtrAVLTree::add(&local_4a8,local_e0,0x1ae);
    cookmem::PtrAVLTree::add(&local_4a8,local_a8,10);
    cookmem::PtrAVLTree::add(&local_4a8,&local_70,0x14);
    if (local_4a8.m_root == (Node *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      iVar2 = 0x40;
    }
    else {
      puts("graph G {");
      cookmem::PtrAVLTree::printNode(local_4a8.m_root);
      puts("}");
      if (local_4a8.m_root != (Node *)0x0) {
        lVar6 = 0;
LAB_001014b4:
        uVar1 = *(ulong *)((long)&local_498 + lVar6 * 0x38 + 8);
        PVar4.m_root = local_4a8.m_root;
        do {
          lVar8 = 0x10;
          if ((uVar1 < (PVar4.m_root)->size) || (lVar8 = 0x18, (PVar4.m_root)->size < uVar1)) {
            PVar4.m_root = *(Node **)((long)&(PVar4.m_root)->reserved + lVar8);
          }
          else {
            do {
              if (PVar4.m_root == (Node *)((long)&local_498 + lVar6 * 0x38)) {
                lVar6 = lVar6 + 1;
                if (lVar6 != 0x14) goto LAB_001014b4;
                local_4a0.m_root = (Node *)0x64;
                iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
                PVar4.m_root = local_4a8.m_root;
                if (&local_2d8 == (Node *)CONCAT44(extraout_var_00,iVar2)) goto joined_r0x00101657;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Mismatch at line ",0x11);
                iVar2 = 0x48;
                goto LAB_00101568;
              }
              PVar4.m_root = (PVar4.m_root)->next;
            } while (PVar4.m_root != (Node *)0x0);
            PVar4.m_root = (Node *)0x0;
          }
        } while (PVar4.m_root != (Node *)0x0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      iVar2 = 0x45;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mismatch at line ",0x11);
    iVar2 = 0x24;
  }
LAB_00101568:
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  goto LAB_00101597;
joined_r0x00101657:
  if (PVar4.m_root != (Node *)0x0) {
    lVar6 = 0x10;
    if ((local_2d8.size < (PVar4.m_root)->size) ||
       (lVar6 = 0x18, (PVar4.m_root)->size < local_2d8.size)) {
      PVar4.m_root = *(Node **)((long)&(PVar4.m_root)->reserved + lVar6);
    }
    else {
      do {
        if (PVar4.m_root == &local_2d8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Mismatch at line ",0x11);
          iVar2 = 0x49;
          goto LAB_00101ce7;
        }
        PVar4.m_root = (PVar4.m_root)->next;
      } while (PVar4.m_root != (Node *)0x0);
      PVar4.m_root = (Node *)0x0;
    }
    goto joined_r0x00101657;
  }
  local_4a0.m_root = (Node *)0x226;
  iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
  PVar4.m_root = local_4a8.m_root;
  if (&local_188 == (Node *)CONCAT44(extraout_var_01,iVar2)) {
    while (PVar4.m_root != (Node *)0x0) {
      lVar6 = 0x10;
      if ((local_188.size < (PVar4.m_root)->size) ||
         (lVar6 = 0x18, (PVar4.m_root)->size < local_188.size)) {
        PVar4.m_root = *(Node **)((long)&(PVar4.m_root)->reserved + lVar6);
      }
      else {
        do {
          if (PVar4.m_root == &local_188) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Mismatch at line ",0x11);
            iVar2 = 0x4c;
            goto LAB_00101ce7;
          }
          PVar4.m_root = (PVar4.m_root)->next;
        } while (PVar4.m_root != (Node *)0x0);
        PVar4.m_root = (Node *)0x0;
      }
    }
    local_4a0.m_root = (Node *)0x14;
    iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
    PVar4.m_root = local_4a8.m_root;
    if (&local_70 == (Node *)CONCAT44(extraout_var_02,iVar2)) {
      while (PVar4.m_root != (Node *)0x0) {
        lVar6 = 0x10;
        if ((local_70.size < (PVar4.m_root)->size) ||
           (lVar6 = 0x18, (PVar4.m_root)->size < local_70.size)) {
          PVar4.m_root = *(Node **)((long)&(PVar4.m_root)->reserved + lVar6);
        }
        else {
          do {
            if (PVar4.m_root == &local_70) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Mismatch at line ",0x11);
              iVar2 = 0x4f;
              goto LAB_00101ce7;
            }
            PVar4.m_root = (PVar4.m_root)->next;
          } while (PVar4.m_root != (Node *)0x0);
          PVar4.m_root = (Node *)0x0;
        }
      }
      local_4a0.m_root = (Node *)0x14;
      iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
      PVar4.m_root = local_4a8.m_root;
      if (&local_380 == (Node *)CONCAT44(extraout_var_03,iVar2)) {
        while (PVar4.m_root != (Node *)0x0) {
          lVar6 = 0x10;
          if ((local_380.size < (PVar4.m_root)->size) ||
             (lVar6 = 0x18, (PVar4.m_root)->size < local_380.size)) {
            PVar4.m_root = *(Node **)((long)&(PVar4.m_root)->reserved + lVar6);
          }
          else {
            do {
              if (PVar4.m_root == &local_380) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Mismatch at line ",0x11);
                iVar2 = 0x51;
                goto LAB_00101ce7;
              }
              PVar4.m_root = (PVar4.m_root)->next;
            } while (PVar4.m_root != (Node *)0x0);
            PVar4.m_root = (Node *)0x0;
          }
        }
        local_4a0.m_root = (Node *)0x14;
        iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
        PVar4.m_root = local_4a8.m_root;
        if (&local_460 == (Node *)CONCAT44(extraout_var_04,iVar2)) {
          while (PVar4.m_root != (Node *)0x0) {
            lVar6 = 0x10;
            if ((local_460.size < (PVar4.m_root)->size) ||
               (lVar6 = 0x18, (PVar4.m_root)->size < local_460.size)) {
              PVar4.m_root = *(Node **)((long)&(PVar4.m_root)->reserved + lVar6);
            }
            else {
              do {
                if (PVar4.m_root == &local_460) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Mismatch at line ",0x11);
                  iVar2 = 0x53;
                  goto LAB_00101ce7;
                }
                PVar4.m_root = (PVar4.m_root)->next;
              } while (PVar4.m_root != (Node *)0x0);
              PVar4.m_root = (Node *)0x0;
            }
          }
          local_4a0.m_root = (Node *)0x50;
          iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
          if (local_310 == (char *)CONCAT44(extraout_var_05,iVar2)) {
            local_4a0.m_root = (Node *)0x19;
            iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
            if (local_428 == (char *)CONCAT44(extraout_var_06,iVar2)) {
              local_4a0.m_root = (Node *)0x2710;
              iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
              if (CONCAT44(extraout_var_07,iVar2) == 0) {
                local_4a0.m_root = (Node *)0x12c;
                iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
                if (local_150 == (char *)CONCAT44(extraout_var_08,iVar2)) {
                  local_4a0.m_root = (Node *)0x12c;
                  iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
                  if (local_1f8 == (char *)CONCAT44(extraout_var_09,iVar2)) {
                    local_4a0.m_root = (Node *)0x12c;
                    iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
                    if (local_118 == (char *)CONCAT44(extraout_var_10,iVar2)) {
                      local_4a0.m_root = (Node *)0x12c;
                      iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
                      if (local_e0 == (char *)CONCAT44(extraout_var_11,iVar2)) {
                        local_4a0.m_root = (Node *)0x2d;
                        iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
                        if (local_3b8 == (char *)CONCAT44(extraout_var_12,iVar2)) {
                          local_4a0.m_root = (Node *)0x2d;
                          iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
                          if (local_268 == (char *)CONCAT44(extraout_var_13,iVar2)) {
                            local_4a0.m_root = (Node *)0x12c;
                            iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
                            if (local_1c0 == (char *)CONCAT44(extraout_var_14,iVar2)) {
                              local_4a0.m_root = (Node *)0xc8;
                              iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0);
                              if (local_230 == (char *)CONCAT44(extraout_var_15,iVar2)) {
                                if (local_4a0.m_root == (Node *)0xdc) {
                                  local_4a0.m_root = (Node *)0xc8;
                                  iVar2 = cookmem::PtrAVLTree::remove(&local_4a8,(char *)&local_4a0)
                                  ;
                                  if (local_2a0 == (char *)CONCAT44(extraout_var_16,iVar2)) {
                                    local_4a0.m_root = (Node *)0xa;
                                    iVar2 = cookmem::PtrAVLTree::remove
                                                      (&local_4a8,(char *)&local_4a0);
                                    if (local_a8 == (char *)CONCAT44(extraout_var_17,iVar2)) {
                                      local_4a0.m_root = (Node *)0xa;
                                      iVar2 = cookmem::PtrAVLTree::remove
                                                        (&local_4a8,(char *)&local_4a0);
                                      if (&local_498 == (Node *)CONCAT44(extraout_var_18,iVar2)) {
                                        local_4a0.m_root = (Node *)0xa;
                                        iVar2 = cookmem::PtrAVLTree::remove
                                                          (&local_4a8,(char *)&local_4a0);
                                        if (local_348 == (char *)CONCAT44(extraout_var_19,iVar2)) {
                                          local_4a0.m_root = (Node *)0xa;
                                          iVar2 = cookmem::PtrAVLTree::remove
                                                            (&local_4a8,(char *)&local_4a0);
                                          if (local_3f0 == (char *)CONCAT44(extraout_var_20,iVar2))
                                          {
                                            if (local_4a8.m_root == (Node *)0x0) {
                                              local_4a0.m_root = (Node *)0x0;
                                              iVar2 = cookmem::PtrAVLTree::remove
                                                                (&local_4a8,(char *)&local_4a0);
                                              if (CONCAT44(extraout_var_21,iVar2) == 0) {
                                                local_4a8.m_root = (Node *)0x0;
                                                cookmem::PtrAVLTree::add(&local_4a8,&local_498,10);
                                                local_4a0.m_root = (Node *)0xa;
                                                cookmem::PtrAVLTree::remove
                                                          (&local_4a8,(char *)&local_4a0);
                                                local_4a0.m_root = (Node *)0x0;
                                                cookmem::PtrAVLTree::add(&local_4a0,&local_498,10);
                                                cookmem::PtrAVLTree::remove
                                                          (&local_4a0,(char *)&local_498);
                                                local_4a8.m_root = (Node *)0x0;
                                                local_4a0.m_root = (Node *)0x0;
                                                iVar2 = cookmem::PtrAVLTree::remove
                                                                  (&local_4a8,(char *)&local_4a0);
                                                iVar7 = 0x8c;
                                                if (CONCAT44(extraout_var_22,iVar2) == 0) {
                                                  lVar6 = 0;
                                                  do {
                                                    if (local_4a8.m_root != (Node *)0x0) {
                                                      uVar1 = *(ulong *)((long)&local_498 +
                                                                        lVar6 * 0x38 + 8);
                                                      PVar4.m_root = local_4a8.m_root;
                                                      do {
                                                        lVar8 = 0x10;
                                                        if ((uVar1 < (PVar4.m_root)->size) ||
                                                           (lVar8 = 0x18,
                                                           (PVar4.m_root)->size < uVar1)) {
                                                          PVar4.m_root = *(Node **)((long)&(PVar4.
                                                  m_root)->reserved + lVar8);
                                                  }
                                                  else {
                                                    do {
                                                      if (PVar4.m_root ==
                                                          (Node *)((long)&local_498 + lVar6 * 0x38))
                                                      {
                                                        iVar7 = 0x90;
                                                        goto LAB_00102243;
                                                      }
                                                      PVar4.m_root = (PVar4.m_root)->next;
                                                    } while (PVar4.m_root != (Node *)0x0);
                                                    PVar4.m_root = (Node *)0x0;
                                                  }
                                                  } while (PVar4.m_root != (Node *)0x0);
                                                  }
                                                  lVar6 = lVar6 + 1;
                                                  } while (lVar6 != 0x14);
                                                  cookmem::PtrAVLTree::add(&local_4a8,&local_498,10)
                                                  ;
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,&local_460,0x14);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_428,0x1e);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_3f0,0x28);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_3b8,0x32);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,&local_380,0x14);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_348,0x28);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_310,0x50);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,&local_2d8,0x96);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_2a0,0xfa);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_268,0x3c);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_230,0xdc);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_1f8,0x14a);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_1c0,0x1b8);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,&local_188,0x226);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_150,0x140);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_118,0x154);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,local_e0,0x1ae);
                                                  cookmem::PtrAVLTree::add(&local_4a8,local_a8,10);
                                                  cookmem::PtrAVLTree::add
                                                            (&local_4a8,&local_70,0x14);
                                                  cookmem::PtrAVLTree::remove
                                                            (&local_4a8,(char *)&local_2d8);
                                                  cookmem::PtrAVLTree::remove
                                                            (&local_4a8,(char *)&local_188);
                                                  cookmem::PtrAVLTree::remove
                                                            (&local_4a8,(char *)&local_70);
                                                  cookmem::PtrAVLTree::remove
                                                            (&local_4a8,(char *)&local_380);
                                                  cookmem::PtrAVLTree::remove
                                                            (&local_4a8,(char *)&local_460);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_310);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_428);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_150);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_1f8);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_118);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_e0);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_3b8);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_268);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_1c0);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_230);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_2a0);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_a8);
                                                  cookmem::PtrAVLTree::remove
                                                            (&local_4a8,(char *)&local_498);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_348);
                                                  cookmem::PtrAVLTree::remove(&local_4a8,local_3f0);
                                                  iVar7 = 0xbd;
                                                  if (local_4a8.m_root == (Node *)0x0) {
                                                    return 0;
                                                  }
                                                }
LAB_00102243:
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,"Mismatch at line "
                                                           ,0x11);
                                                plVar3 = (long *)std::ostream::operator<<
                                                                           ((ostream *)&std::cout,
                                                                            iVar7);
                                                std::ios::widen((char)*(undefined8 *)
                                                                       (*plVar3 + -0x18) +
                                                                (char)plVar3);
                                                std::ostream::put((char)plVar3);
                                                std::ostream::flush();
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,"Mismatch at line "
                                                           ,0x11);
                                                iVar2 = 200;
                                                goto LAB_001015ba;
                                              }
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,"Mismatch at line ",
                                                         0x11);
                                              iVar2 = 0x67;
                                            }
                                            else {
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,"Mismatch at line ",
                                                         0x11);
                                              iVar2 = 0x66;
                                            }
                                          }
                                          else {
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,"Mismatch at line ",
                                                       0x11);
                                            iVar2 = 100;
                                          }
                                        }
                                        else {
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"Mismatch at line ",0x11)
                                          ;
                                          iVar2 = 99;
                                        }
                                      }
                                      else {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,"Mismatch at line ",0x11);
                                        iVar2 = 0x62;
                                      }
                                    }
                                    else {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"Mismatch at line ",0x11);
                                      iVar2 = 0x61;
                                    }
                                  }
                                  else {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"Mismatch at line ",0x11);
                                    iVar2 = 0x60;
                                  }
                                }
                                else {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"Mismatch at line ",0x11);
                                  iVar2 = 0x5f;
                                }
                              }
                              else {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,"Mismatch at line ",0x11);
                                iVar2 = 0x5e;
                              }
                            }
                            else {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,"Mismatch at line ",0x11);
                              iVar2 = 0x5d;
                            }
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"Mismatch at line ",0x11);
                            iVar2 = 0x5c;
                          }
                        }
                        else {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"Mismatch at line ",0x11);
                          iVar2 = 0x5b;
                        }
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,"Mismatch at line ",0x11);
                        iVar2 = 0x5a;
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"Mismatch at line ",0x11);
                      iVar2 = 0x59;
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Mismatch at line ",0x11);
                    iVar2 = 0x58;
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Mismatch at line ",0x11);
                  iVar2 = 0x57;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Mismatch at line ",0x11);
                iVar2 = 0x56;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Mismatch at line ",0x11);
              iVar2 = 0x55;
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Mismatch at line ",0x11);
            iVar2 = 0x54;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Mismatch at line ",0x11);
          iVar2 = 0x52;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Mismatch at line ",0x11);
        iVar2 = 0x50;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      iVar2 = 0x4e;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mismatch at line ",0x11);
    iVar2 = 0x4b;
  }
LAB_00101ce7:
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::endl<char,std::char_traits<char>>(poVar5);
LAB_00101597:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mismatch at line ",0x11)
  ;
  iVar2 = 0xc5;
LAB_001015ba:
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return 1;
}

Assistant:

int
main (int argc, const char* argv[])
{
    ASSERT_EQ (0, test1 ());
    ASSERT_EQ (0, test2 ());
    ASSERT_EQ (0, test3 ());
    ASSERT_EQ (0, test4 ());
    return 0;
}